

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.c
# Opt level: O0

void Scope_Push(Scope *scope,Denoted *declarator,Translation_Data *translation_data)

{
  Translation_Data *translation_data_local;
  Denoted *declarator_local;
  Scope *scope_local;
  
  switch(declarator->denotation) {
  case DT_Label:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/semantics/identifiers/scope.c"
                  ,0x74,
                  "void Scope_Push(struct Scope *, struct Denoted *, struct Translation_Data *)");
  case DT_Object:
    push_object(scope,translation_data,(Denoted_Object *)declarator);
    break;
  case DT_Typedef:
    push_typedef(scope,translation_data,(Denoted_Typedef *)declarator);
    break;
  case DT_Function:
    push_function(scope,translation_data,(Denoted_Function *)declarator);
    break;
  case DT_Enum:
    push_denoted_enum_tag(scope,translation_data,(Denoted_Enum *)declarator);
    break;
  case DT_Enum_Constant:
    push_denoted_enum_constant(scope,translation_data,(Denoted_Enum_Const *)declarator);
    break;
  case DT_Struct_Union_Member:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/semantics/identifiers/scope.c"
                  ,0x82,
                  "void Scope_Push(struct Scope *, struct Denoted *, struct Translation_Data *)");
  case DT_Struct_Union_Tag:
    push_denoted_struct_union_tag(scope,translation_data,(Denoted_Struct_Union *)declarator);
  }
  return;
}

Assistant:

void Scope_Push(struct Scope *scope,struct Denoted *declarator,struct Translation_Data *translation_data)
{

	switch(declarator->denotation)
	{
		case DT_Label:
			/*perhaps lables should be denoted*/
			assert(0);
		case DT_Function:
			push_function(scope,translation_data,AS_DENOTED_FUNCTION(declarator));
			break;
		case DT_Object:
			push_object(scope,translation_data,AS_DENOTED_OBJECT_PTR(declarator));
			break;
		case DT_Typedef:
			push_typedef(scope,translation_data,AS_DENOTED_TYPEDEF(declarator));
			break;
		case DT_Enum_Constant:
			push_denoted_enum_constant(scope,translation_data,AS_DENOTED_ENUM_CONST(declarator));
			break;
		case DT_Struct_Union_Member:
			assert(0);
			break;
		case DT_Enum:
			push_denoted_enum_tag(scope,translation_data,AS_DENOTED_ENUM(declarator));
			break;
		case DT_Struct_Union_Tag:
			push_denoted_struct_union_tag(scope,translation_data,AS_DENOTED_STRUCT_UNION(declarator));
			break;
	}


}